

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O2

uint64_t msr_set_limits(raplcap_msr_ctx *ctx,raplcap_zone zone,uint64_t msrval,
                       raplcap_limit *limit_long,raplcap_limit *limit_short)

{
  uint64_t uVar1;
  uint8_t last;
  uint8_t first;
  uint8_t last_00;
  uint8_t last_01;
  uint8_t first_00;
  uint8_t last_02;
  
  if (ctx == (raplcap_msr_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x29f,
                  "uint64_t msr_set_limits(const raplcap_msr_ctx *, raplcap_zone, uint64_t, const raplcap_limit *, const raplcap_limit *)"
                 );
  }
  last = '7';
  first = '1';
  last_00 = '.';
  last_01 = '\x17';
  first_00 = '\x11';
  last_02 = '\x0e';
  if ((zone == RAPLCAP_ZONE_PSYS) && ((ctx->cpu_model | 0x40) == 0xcf)) {
    last = '9';
    first = '3';
    last_00 = '0';
    last_01 = '\x19';
    first_00 = '\x13';
    last_02 = '\x10';
  }
  if (limit_long != (raplcap_limit *)0x0) {
    if (0.0 < limit_long->watts) {
      uVar1 = (*ctx->cfg[zone].to_msr_pl)(limit_long->watts,ctx->power_units);
      msrval = replace_bits(msrval,uVar1,'\0',last_02);
    }
    if (0.0 < limit_long->seconds) {
      uVar1 = (*ctx->cfg[zone].to_msr_tw)(limit_long->seconds,ctx->time_units);
      msrval = replace_bits(msrval,uVar1,first_00,last_01);
    }
  }
  if (limit_short != (raplcap_limit *)0x0) {
    if (1 < ctx->cfg[zone].constraints) {
      if (0.0 < limit_short->watts) {
        uVar1 = (*ctx->cfg[zone].to_msr_pl)(limit_short->watts,ctx->power_units);
        msrval = replace_bits(msrval,uVar1,' ',last_00);
      }
      if (0.0 < limit_short->seconds) {
        if (zone != RAPLCAP_ZONE_PSYS) {
          uVar1 = (*ctx->cfg[zone].to_msr_tw)(limit_short->seconds,ctx->time_units);
          uVar1 = replace_bits(msrval,uVar1,first,last);
          return uVar1;
        }
        fprintf(_stderr,"%s [%s] ","[WARN] ","raplcap-msr");
        fwrite("Not allowed to set PSys/Platform short term time window\n",0x38,1,_stderr);
      }
    }
  }
  return msrval;
}

Assistant:

uint64_t msr_set_limits(const raplcap_msr_ctx* ctx, raplcap_zone zone, uint64_t msrval,
                        const raplcap_limit* limit_long, const raplcap_limit* limit_short) {
  assert(ctx != NULL);
  uint8_t pl1_last = 14;
  uint8_t tw1_first = 17;
  uint8_t tw1_last = 23;
  uint8_t pl2_last = 46;
  uint8_t tw2_first = 49;
  uint8_t tw2_last = 55;
  zone_limits_quirks(ctx, zone, &pl1_last, &tw1_first, &tw1_last, &pl2_last, &tw2_first, &tw2_last, NULL);
  if (limit_long != NULL) {
    raplcap_log(DEBUG, "msr_set_limits: zone=%d, long_term:\n\ttime=%.12f s\n\tpower=%.12f W\n",
                zone, limit_long->seconds, limit_long->watts);
    if (limit_long->watts > 0) {
      msrval = replace_bits(msrval, ctx->cfg[zone].to_msr_pl(limit_long->watts, ctx->power_units), 0, pl1_last);
    }
    if (limit_long->seconds > 0) {
      msrval = replace_bits(msrval, ctx->cfg[zone].to_msr_tw(limit_long->seconds, ctx->time_units), tw1_first,
                            tw1_last);
    }
  }
  if (limit_short != NULL && HAS_SHORT_TERM(ctx, zone)) {
    raplcap_log(DEBUG, "msr_set_limits: zone=%d, short_term:\n\ttime=%.12f s\n\tpower=%.12f W\n",
                zone, limit_short->seconds, limit_short->watts);
    if (limit_short->watts > 0) {
      msrval = replace_bits(msrval, ctx->cfg[zone].to_msr_pl(limit_short->watts, ctx->power_units), 32, pl2_last);
    }
    if (limit_short->seconds > 0) {
      // 16.10.3: This field may have a hard-coded value in hardware and ignores values written by software.
      if (zone == RAPLCAP_ZONE_PSYS) {
        // Table 2-39: PSYS has power limit #2, but time window #2 is chosen by the processor
        raplcap_log(WARN, "Not allowed to set PSys/Platform short term time window\n");
      } else {
        msrval = replace_bits(msrval, ctx->cfg[zone].to_msr_tw(limit_short->seconds, ctx->time_units), tw2_first,
                              tw2_last);
      }
    }
  }
  return msrval;
}